

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieCec.c
# Opt level: O0

Vec_Ptr_t * Abc_NtkDfsBoxes(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Vec_Ptr_t *vNodes_00;
  Abc_Obj_t *pAVar2;
  int local_24;
  int i;
  Abc_Obj_t *pObj;
  Vec_Ptr_t *vNodes;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkIsNetlist(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHieCec.c"
                  ,0x6d,"Vec_Ptr_t *Abc_NtkDfsBoxes(Abc_Ntk_t *)");
  }
  Abc_NtkIncrementTravId(pNtk);
  vNodes_00 = Vec_PtrAlloc(100);
  for (local_24 = 0; iVar1 = Abc_NtkPoNum(pNtk), local_24 < iVar1; local_24 = local_24 + 1) {
    pAVar2 = Abc_NtkPo(pNtk,local_24);
    pAVar2 = Abc_ObjFaninReal(pAVar2,0);
    Abc_NtkDfsBoxes_rec(pAVar2,vNodes_00);
  }
  return vNodes_00;
}

Assistant:

Vec_Ptr_t * Abc_NtkDfsBoxes( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pObj;
    int i;
    assert( Abc_NtkIsNetlist(pNtk) );
    // set the traversal ID
    Abc_NtkIncrementTravId( pNtk );
    // start the array of nodes
    vNodes = Vec_PtrAlloc( 100 );
    Abc_NtkForEachPo( pNtk, pObj, i )
        Abc_NtkDfsBoxes_rec( Abc_ObjFaninReal(pObj, 0), vNodes );
    return vNodes;
}